

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_peak2_get_heap_size(ma_peak2_config *pConfig,size_t *pHeapSizeInBytes)

{
  ma_result mVar1;
  undefined4 *in_RDI;
  size_t *pHeapSizeInBytes_00;
  ma_biquad_config *pConfig_00;
  ma_biquad_config bqConfig_1;
  ma_biquad_config bqConfig;
  double A;
  double a;
  double c;
  double s;
  double w;
  double q;
  undefined4 local_e0;
  undefined4 local_dc;
  double local_d8;
  undefined1 local_a8 [72];
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  undefined4 *local_30;
  double local_28;
  undefined8 local_20;
  double local_18;
  double local_10;
  double local_8;
  
  local_38 = *(double *)(in_RDI + 6);
  local_40 = (*(double *)(in_RDI + 8) * 6.283185307179586) / (double)(uint)in_RDI[2];
  local_30 = in_RDI;
  local_18 = local_40;
  local_48 = sin(local_40);
  local_10 = local_40;
  local_8 = 1.5707963267948966 - local_40;
  local_50 = sin(local_8);
  local_58 = local_48 / (local_38 * 2.0);
  local_28 = *(double *)(local_30 + 4) / 40.0;
  local_20 = 0x4024000000000000;
  local_60 = pow(10.0,local_28);
  local_d8 = local_58 * local_60 + 1.0;
  pHeapSizeInBytes_00 = (size_t *)(local_50 * -2.0);
  pConfig_00 = (ma_biquad_config *)(-local_58 * local_60 + 1.0);
  local_e0 = *local_30;
  local_dc = local_30[1];
  memcpy(local_a8,&local_e0,0x38);
  mVar1 = ma_biquad_get_heap_size(pConfig_00,pHeapSizeInBytes_00);
  return mVar1;
}

Assistant:

MA_API ma_result ma_peak2_get_heap_size(const ma_peak2_config* pConfig, size_t* pHeapSizeInBytes)
{
    ma_biquad_config bqConfig;
    bqConfig = ma_peak2__get_biquad_config(pConfig);

    return ma_biquad_get_heap_size(&bqConfig, pHeapSizeInBytes);
}